

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_slbfee_(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx;
  TCGLabel *l;
  TCGLabel *a1;
  TCGTemp *local_48;
  long local_40;
  
  if (ctx->pr != true) {
    tcg_ctx = ctx->uc->tcg_ctx;
    local_48 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_40 = (long)&tcg_ctx->pool_cur +
               *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 8 & 0xf8));
    tcg_gen_callN_ppc64(tcg_ctx,helper_find_slb_vsid,
                        (TCGTemp *)
                        ((long)&tcg_ctx->pool_cur +
                        *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8))),2,&local_48)
    ;
    l = gen_new_label_ppc64(tcg_ctx);
    a1 = gen_new_label_ppc64(tcg_ctx);
    tcg_gen_extrl_i64_i32_ppc64(tcg_ctx,cpu_crf[0],cpu_so);
    tcg_gen_brcondi_i64_ppc64
              (tcg_ctx,TCG_COND_EQ,
               *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),-1,l);
    tcg_gen_ori_i32_ppc64(tcg_ctx,cpu_crf[0],cpu_crf[0],2);
    *(short *)&a1->field_0x2 = (short)((uint)*(ushort *)&a1->field_0x2 * 0x10000 + 0x10000 >> 0x10);
    tcg_gen_op1_ppc64(tcg_ctx,INDEX_op_br,(TCGArg)a1);
    *(byte *)l = *(byte *)l | 1;
    tcg_gen_op1_ppc64(tcg_ctx,INDEX_op_set_label,(TCGArg)l);
    tcg_gen_op2_ppc64(tcg_ctx,INDEX_op_movi_i64,
                      (long)&tcg_ctx->pool_cur +
                      *(long *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8)),0);
    *(byte *)a1 = *(byte *)a1 | 1;
    tcg_gen_op1_ppc64(tcg_ctx,INDEX_op_set_label,(TCGArg)a1);
    return;
  }
  gen_exception_err(ctx,0x60,0x22);
  return;
}

Assistant:

static void gen_slbfee_(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGLabel *l1, *l2;

    if (unlikely(ctx->pr)) {
        gen_inval_exception(ctx, POWERPC_EXCP_PRIV_REG);
        return;
    }
    gen_helper_find_slb_vsid(tcg_ctx, cpu_gpr[rS(ctx->opcode)], tcg_ctx->cpu_env,
                             cpu_gpr[rB(ctx->opcode)]);
    l1 = gen_new_label(tcg_ctx);
    l2 = gen_new_label(tcg_ctx);
    tcg_gen_trunc_tl_i32(tcg_ctx, cpu_crf[0], cpu_so);
    tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_EQ, cpu_gpr[rS(ctx->opcode)], -1, l1);
    tcg_gen_ori_i32(tcg_ctx, cpu_crf[0], cpu_crf[0], CRF_EQ);
    tcg_gen_br(tcg_ctx, l2);
    gen_set_label(tcg_ctx, l1);
    tcg_gen_movi_tl(tcg_ctx, cpu_gpr[rS(ctx->opcode)], 0);
    gen_set_label(tcg_ctx, l2);
}